

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGIsNullable(xmlRelaxNGDefinePtr_conflict define)

{
  ushort uVar1;
  uint uVar2;
  xmlRelaxNGDefinePtr define_00;
  int iVar3;
  xmlRelaxNGDefinePtr define_01;
  
  if (define == (xmlRelaxNGDefinePtr_conflict)0x0) {
switchD_00188f10_default:
    define_00 = (xmlRelaxNGDefinePtr_conflict)0xffffffff;
    goto switchD_00188f10_caseD_e;
  }
  define_00 = (xmlRelaxNGDefinePtr)&DAT_00000001;
  if (((define->dflags & 1U) != 0) ||
     (define_00 = (xmlRelaxNGDefinePtr_conflict)0x0, (define->dflags & 2U) != 0))
  goto switchD_00188f10_caseD_e;
  define_00 = (xmlRelaxNGDefinePtr_conflict)0xffffffff;
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
  case XML_RELAXNG_TEXT:
    uVar2 = 1;
    break;
  case XML_RELAXNG_NOT_ALLOWED:
  case XML_RELAXNG_EXCEPT:
  case XML_RELAXNG_ELEMENT:
  case XML_RELAXNG_DATATYPE:
  case XML_RELAXNG_PARAM:
  case XML_RELAXNG_VALUE:
  case XML_RELAXNG_LIST:
  case XML_RELAXNG_ATTRIBUTE:
    uVar2 = 0;
    break;
  case XML_RELAXNG_OPTIONAL:
  case XML_RELAXNG_ZEROORMORE:
    goto switchD_00188f10_caseD_e;
  case XML_RELAXNG_CHOICE:
    iVar3 = 2;
    for (define_00 = define->content; uVar2 = 0, define_00 != (xmlRelaxNGDefinePtr_conflict)0x0;
        define_00 = define_00->next) {
      uVar2 = xmlRelaxNGIsNullable(define_00);
      if (uVar2 != 0) {
        iVar3 = 5;
        break;
      }
    }
    if ((iVar3 != 2) && (iVar3 != 5)) goto switchD_00188f10_caseD_e;
    break;
  case XML_RELAXNG_GROUP:
  case XML_RELAXNG_INTERLEAVE:
  case XML_RELAXNG_START:
    define_00 = (xmlRelaxNGDefinePtr)&DAT_00000001;
    for (define_01 = define->content; define_01 != (xmlRelaxNGDefinePtr_conflict)0x0;
        define_01 = define_01->next) {
      uVar2 = xmlRelaxNGIsNullable(define_01);
      if (uVar2 != 1) goto LAB_00188f61;
    }
    uVar2 = 1;
LAB_00188f61:
    if (define_01 == (xmlRelaxNGDefinePtr_conflict)0x0) goto switchD_00188f10_caseD_e;
    break;
  case XML_RELAXNG_NOOP:
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_REF:
  case XML_RELAXNG_EXTERNALREF:
  case XML_RELAXNG_PARENTREF:
  case XML_RELAXNG_ONEORMORE:
    uVar2 = xmlRelaxNGIsNullable(define->content);
    break;
  default:
    goto switchD_00188f10_default;
  }
  if (uVar2 == 0) {
    uVar1 = 2;
LAB_00188f79:
    define->dflags = define->dflags | uVar1;
  }
  else if (uVar2 == 1) {
    uVar1 = 1;
    goto LAB_00188f79;
  }
  define_00 = (xmlRelaxNGDefinePtr)(ulong)uVar2;
switchD_00188f10_caseD_e:
  return (int)define_00;
}

Assistant:

static int
xmlRelaxNGIsNullable(xmlRelaxNGDefinePtr define)
{
    int ret;

    if (define == NULL)
        return (-1);

    if (define->dflags & IS_NULLABLE)
        return (1);
    if (define->dflags & IS_NOT_NULLABLE)
        return (0);
    switch (define->type) {
        case XML_RELAXNG_EMPTY:
        case XML_RELAXNG_TEXT:
            ret = 1;
            break;
        case XML_RELAXNG_NOOP:
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
        case XML_RELAXNG_ONEORMORE:
            ret = xmlRelaxNGIsNullable(define->content);
            break;
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_NOT_ALLOWED:
        case XML_RELAXNG_ELEMENT:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_ATTRIBUTE:
            ret = 0;
            break;
        case XML_RELAXNG_CHOICE:{
                xmlRelaxNGDefinePtr list = define->content;

                while (list != NULL) {
                    ret = xmlRelaxNGIsNullable(list);
                    if (ret != 0)
                        goto done;
                    list = list->next;
                }
                ret = 0;
                break;
            }
        case XML_RELAXNG_START:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_GROUP:{
                xmlRelaxNGDefinePtr list = define->content;

                while (list != NULL) {
                    ret = xmlRelaxNGIsNullable(list);
                    if (ret != 1)
                        goto done;
                    list = list->next;
                }
                return (1);
            }
        default:
            return (-1);
    }
  done:
    if (ret == 0)
        define->dflags |= IS_NOT_NULLABLE;
    if (ret == 1)
        define->dflags |= IS_NULLABLE;
    return (ret);
}